

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThread.cpp
# Opt level: O0

bool __thiscall xmrig::OclThread::isEqual(OclThread *this,OclThread *other)

{
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> __first2;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_iterator __first1;
  const_iterator __last1;
  byte *in_RSI;
  byte *in_RDI;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar4;
  
  sVar2 = std::vector<long,_std::allocator<long>_>::size
                    ((vector<long,_std::allocator<long>_> *)(in_RSI + 0x10));
  sVar3 = std::vector<long,_std::allocator<long>_>::size
                    ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x10));
  uVar4 = false;
  if (sVar2 == sVar3) {
    std::vector<long,_std::allocator<long>_>::begin(in_stack_ffffffffffffffb8);
    __first1 = std::vector<long,_std::allocator<long>_>::end(in_stack_ffffffffffffffb8);
    __last1 = std::vector<long,_std::allocator<long>_>::begin(in_stack_ffffffffffffffb8);
    __first2._M_current._7_1_ = uVar4;
    __first2._M_current._0_7_ = in_stack_ffffffffffffffd0;
    bVar1 = std::
            equal<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>
                      ((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
                       __first1._M_current,
                       (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
                       __last1._M_current,__first2);
    uVar4 = false;
    if ((((((bVar1) && (uVar4 = false, *(int *)(in_RSI + 0x28) == *(int *)(in_RDI + 0x28))) &&
          (uVar4 = false, (*in_RSI & 1) == (*in_RDI & 1))) &&
         ((uVar4 = false, (in_RSI[1] & 1) == (in_RDI[1] & 1) &&
          (uVar4 = false, *(int *)(in_RSI + 0x2c) == *(int *)(in_RDI + 0x2c))))) &&
        ((uVar4 = false, *(int *)(in_RSI + 0x30) == *(int *)(in_RDI + 0x30) &&
         ((uVar4 = false, *(int *)(in_RSI + 0x34) == *(int *)(in_RDI + 0x34) &&
          (uVar4 = false, *(int *)(in_RSI + 0x38) == *(int *)(in_RDI + 0x38))))))) &&
       (uVar4 = false, *(int *)(in_RSI + 0x3c) == *(int *)(in_RDI + 0x3c))) {
      uVar4 = *(int *)(in_RSI + 0x40) == *(int *)(in_RDI + 0x40);
    }
  }
  return (bool)uVar4;
}

Assistant:

bool xmrig::OclThread::isEqual(const OclThread &other) const
{
    return other.m_threads.size() == m_threads.size() &&
           std::equal(m_threads.begin(), m_threads.end(), other.m_threads.begin()) &&
           other.m_bfactor      == m_bfactor &&
           other.m_datasetHost  == m_datasetHost &&
           other.m_gcnAsm       == m_gcnAsm &&
           other.m_index        == m_index &&
           other.m_intensity    == m_intensity &&
           other.m_memChunk     == m_memChunk &&
           other.m_stridedIndex == m_stridedIndex &&
           other.m_unrollFactor == m_unrollFactor &&
           other.m_worksize     == m_worksize;
}